

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

void __thiscall
FastPForLib::Simple16<false>::fakeencodeArray
          (Simple16<false> *this,uint32_t *in,size_t length,size_t *nvalue)

{
  bool bVar1;
  long *in_RCX;
  ulong in_RDX;
  uint32_t *in_RSI;
  size_t ValuesRemaining;
  size_t writtenout;
  uint32_t NumberOfValuesCoded;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  long local_30;
  uint local_24;
  uint32_t *local_10;
  
  local_30 = 0;
  local_10 = in_RSI;
  for (local_38 = in_RDX; local_38 != 0; local_38 = local_38 - local_24) {
    bVar1 = tryme<28u,1u>(local_10,local_38);
    local_74 = (uint)local_38;
    if (bVar1) {
      local_3c = local_74;
      if (0x1b < local_38) {
        local_3c = 0x1c;
      }
      local_24 = local_3c;
    }
    else {
      bVar1 = tryme<7u,2u,14u,1u>(local_10,local_38);
      if (bVar1) {
        local_40 = local_74;
        if (0x14 < local_38) {
          local_40 = 0x15;
        }
        local_24 = local_40;
      }
      else {
        bVar1 = tryme<7u,1u,7u,2u,7u,1u>(local_10,local_38);
        if (bVar1) {
          local_44 = local_74;
          if (0x14 < local_38) {
            local_44 = 0x15;
          }
          local_24 = local_44;
        }
        else {
          bVar1 = tryme<14u,1u,7u,2u>(local_10,local_38);
          if (bVar1) {
            local_48 = local_74;
            if (0x14 < local_38) {
              local_48 = 0x15;
            }
            local_24 = local_48;
          }
          else {
            bVar1 = tryme<14u,2u>(local_10,local_38);
            if (bVar1) {
              local_4c = local_74;
              if (0xd < local_38) {
                local_4c = 0xe;
              }
              local_24 = local_4c;
            }
            else {
              bVar1 = tryme<1u,4u,8u,3u>(local_10,local_38);
              if (bVar1) {
                local_50 = local_74;
                if (8 < local_38) {
                  local_50 = 9;
                }
                local_24 = local_50;
              }
              else {
                bVar1 = tryme<1u,3u,4u,4u,3u,3u>(local_10,local_38);
                if (bVar1) {
                  local_54 = local_74;
                  if (7 < local_38) {
                    local_54 = 8;
                  }
                  local_24 = local_54;
                }
                else {
                  bVar1 = tryme<7u,4u>(local_10,local_38);
                  if (bVar1) {
                    local_58 = local_74;
                    if (6 < local_38) {
                      local_58 = 7;
                    }
                    local_24 = local_58;
                  }
                  else {
                    bVar1 = tryme<4u,5u,2u,4u>(local_10,local_38);
                    if (bVar1) {
                      local_5c = local_74;
                      if (5 < local_38) {
                        local_5c = 6;
                      }
                      local_24 = local_5c;
                    }
                    else {
                      bVar1 = tryme<2u,4u,4u,5u>(local_10,local_38);
                      if (bVar1) {
                        local_60 = local_74;
                        if (5 < local_38) {
                          local_60 = 6;
                        }
                        local_24 = local_60;
                      }
                      else {
                        bVar1 = tryme<3u,6u,2u,5u>(local_10,local_38);
                        if (bVar1) {
                          local_64 = local_74;
                          if (4 < local_38) {
                            local_64 = 5;
                          }
                          local_24 = local_64;
                        }
                        else {
                          bVar1 = tryme<2u,5u,3u,6u>(local_10,local_38);
                          if (bVar1) {
                            local_68 = local_74;
                            if (4 < local_38) {
                              local_68 = 5;
                            }
                            local_24 = local_68;
                          }
                          else {
                            bVar1 = tryme<4u,7u>(local_10,local_38);
                            if (bVar1) {
                              local_6c = local_74;
                              if (3 < local_38) {
                                local_6c = 4;
                              }
                              local_24 = local_6c;
                            }
                            else {
                              bVar1 = tryme<1u,10u,2u,9u>(local_10,local_38);
                              if (bVar1) {
                                local_70 = local_74;
                                if (2 < local_38) {
                                  local_70 = 3;
                                }
                                local_24 = local_70;
                              }
                              else {
                                bVar1 = tryme<2u,14u>(local_10,local_38);
                                if (bVar1) {
                                  if (1 < local_38) {
                                    local_74 = 2;
                                  }
                                  local_24 = local_74;
                                }
                                else {
                                  local_24 = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_10 = local_10 + local_24;
    local_30 = local_30 + 1;
  }
  *in_RCX = local_30;
  return;
}

Assistant:

void Simple16<MarkLength>::fakeencodeArray(const uint32_t *in,
                                           const size_t length,
                                           size_t &nvalue) {
  uint32_t NumberOfValuesCoded = 0;
  size_t writtenout = 0;
  size_t ValuesRemaining(length);
  while (ValuesRemaining > 0) {
    if (tryme<28, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 28) ? static_cast<uint32_t>(ValuesRemaining) : 28;
    } else if (tryme<7, 2, 14, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 + 14)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 + 14;
    } else if (tryme<7, 1, 7, 2, 7, 1>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 7 * 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 7 * 3;
    } else if (tryme<14, 1, 7, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 14 + 7)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 14 + 7;
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 14) ? static_cast<uint32_t>(ValuesRemaining) : 14;
    } else if (tryme<1, 4, 8, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 9) ? static_cast<uint32_t>(ValuesRemaining) : 9;
    } else if (tryme<1, 3, 4, 4, 3, 3>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 1 + 4 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 1 + 4 + 3;
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
    } else if (tryme<4, 5, 2, 4>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 4 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 4 + 2;
    } else if (tryme<2, 4, 4, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 4)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 4;
    } else if (tryme<3, 6, 2, 5>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 3 + 2)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 3 + 2;
    } else if (tryme<2, 5, 3, 6>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 2 + 3)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 2 + 3;
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
    } else if (tryme<1, 10, 2, 9>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
    } else {
      NumberOfValuesCoded = 1;
    }
    in += NumberOfValuesCoded;
    ValuesRemaining -= NumberOfValuesCoded;
    ++writtenout;
  }
  nvalue = writtenout;
}